

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# allocator_std.c
# Opt level: O1

MPP_RET allocator_std_open(void **ctx,size_t alignment,MppAllocFlagType flags)

{
  size_t *psVar1;
  MPP_RET MVar2;
  
  if (ctx == (void **)0x0) {
    _mpp_log_l(2,(char *)0x0,"do not accept NULL input\n","allocator_std_open");
    MVar2 = MPP_ERR_NULL_PTR;
  }
  else {
    _mpp_log_l(2,(char *)0x0,"Warning: std allocator should be used on simulation mode only\n",
               "allocator_std_open");
    psVar1 = (size_t *)mpp_osal_malloc("allocator_std_open",0x10);
    if (psVar1 != (size_t *)0x0) {
      *psVar1 = alignment;
      *(MppAllocFlagType *)(psVar1 + 1) = flags;
      *(undefined4 *)((long)psVar1 + 0xc) = 0;
    }
    *ctx = psVar1;
    MVar2 = -(uint)(psVar1 == (size_t *)0x0);
  }
  return MVar2;
}

Assistant:

static MPP_RET allocator_std_open(void **ctx, size_t alignment, MppAllocFlagType flags)
{
    allocator_ctx *p = NULL;

    if (NULL == ctx) {
        mpp_err_f("do not accept NULL input\n");
        return MPP_ERR_NULL_PTR;
    }

    mpp_err_f("Warning: std allocator should be used on simulation mode only\n");

    p = mpp_malloc(allocator_ctx, 1);
    if (p) {
        p->alignment = alignment;
        p->flags = flags;
        p->fd_count = 0;
    }

    *ctx = p;
    return p ? MPP_OK : MPP_NOK;
}